

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::HandleSehExceptionsInMethodIfSupported<testing::internal::UnitTestImpl,bool>
               (UnitTestImpl *object,offset_in_UnitTestImpl_to_subr method,char *location)

{
  byte bVar1;
  long in_RDX;
  code *in_RSI;
  long in_RDI;
  code *local_48;
  
  local_48 = in_RSI;
  if (((ulong)in_RSI & 1) != 0) {
    local_48 = *(code **)(in_RSI + *(long *)(in_RDI + in_RDX) + -1);
  }
  bVar1 = (*local_48)((long *)(in_RDI + in_RDX));
  return (bool)(bVar1 & 1);
}

Assistant:

Result HandleSehExceptionsInMethodIfSupported(T* object, Result (T::*method)(),
                                              const char* location) {
#if GTEST_HAS_SEH
  __try {
    return (object->*method)();
  } __except (internal::UnitTestOptions::GTestProcessSEH(  // NOLINT
      GetExceptionCode(), location)) {
    return static_cast<Result>(0);
  }
#else
  (void)location;
  return (object->*method)();
#endif  // GTEST_HAS_SEH
}